

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

void absl::strings_internal::AppendPieces
               (Nonnull<std::string_*> dest,
               initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces)

{
  bool bVar1;
  void *pvVar2;
  size_type sVar3;
  const_pointer pvVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong in_RDI;
  size_t this_size;
  string_view piece_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__range2_1;
  char *out;
  char *begin;
  string_view piece;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__range2;
  size_t to_append;
  size_t old_size;
  size_t in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  const_iterator local_78;
  const_iterator local_70;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *local_68;
  void *local_60;
  long local_58;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  const_iterator local_40;
  const_iterator local_38;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *local_30;
  long local_28;
  long local_20;
  ulong local_18;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> local_10;
  
  local_18 = in_RDI;
  local_20 = std::__cxx11::string::size();
  local_28 = 0;
  local_30 = &local_10;
  local_38 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                       (local_30);
  local_40 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::end
                       ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        in_stack_ffffffffffffff40);
  for (; local_38 != local_40; local_38 = local_38 + 1) {
    local_50._M_len = local_38->_M_len;
    local_50._M_str = local_38->_M_str;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_50);
    bVar1 = true;
    if (sVar3 != 0) {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_50);
      lVar5 = std::__cxx11::string::data();
      uVar6 = std::__cxx11::string::size();
      bVar1 = uVar6 < (ulong)((long)pvVar4 - lVar5);
    }
    if (!bVar1) {
      __assert_fail("((piece).size() == 0) || (uintptr_t((piece).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                    ,0xa7,
                    "void absl::strings_internal::AppendPieces(absl::Nonnull<std::string *>, std::initializer_list<absl::string_view>)"
                   );
    }
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_50);
    local_28 = sVar3 + local_28;
  }
  anon_unknown_5::STLStringAppendUninitializedAmortized
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_58 = std::__cxx11::string::operator[](local_18);
  local_60 = (void *)(local_58 + local_20);
  local_68 = &local_10;
  local_70 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                       (local_68);
  local_78 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::end
                       ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        in_stack_ffffffffffffff40);
  for (; pvVar2 = local_60, local_70 != local_78; local_70 = local_70 + 1) {
    local_88._M_len = local_70->_M_len;
    local_88._M_str = local_70->_M_str;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_88);
    pvVar2 = local_60;
    if (sVar3 != 0) {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_88);
      memcpy(pvVar2,pvVar4,sVar3);
      local_60 = (void *)(sVar3 + (long)local_60);
    }
  }
  lVar5 = local_58;
  lVar7 = std::__cxx11::string::size();
  if (pvVar2 == (void *)(lVar5 + lVar7)) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                ,0xb5,
                "void absl::strings_internal::AppendPieces(absl::Nonnull<std::string *>, std::initializer_list<absl::string_view>)"
               );
}

Assistant:

void AppendPieces(absl::Nonnull<std::string*> dest,
                  std::initializer_list<absl::string_view> pieces) {
  size_t old_size = dest->size();
  size_t to_append = 0;
  for (absl::string_view piece : pieces) {
    ASSERT_NO_OVERLAP(*dest, piece);
    to_append += piece.size();
  }
  STLStringAppendUninitializedAmortized(dest, to_append);

  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  for (absl::string_view piece : pieces) {
    const size_t this_size = piece.size();
    if (this_size != 0) {
      memcpy(out, piece.data(), this_size);
      out += this_size;
    }
  }
  assert(out == begin + dest->size());
}